

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extradata.cpp
# Opt level: O3

void __thiscall icu_63::ExtraData::writeExtraData(ExtraData *this,UChar32 c,Norm *norm)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  int32_t iVar4;
  UnicodeString *pUVar5;
  ExtraData *pEVar6;
  Hashtable *previousMappings;
  int32_t iVar7;
  
  pEVar6 = this;
  switch(norm->type) {
  case INERT:
  case MAYBE_YES_SIMPLE:
  case YES_YES_WITH_CC:
    goto switchD_001df820_caseD_1;
  case YES_YES_COMBINES_FWD:
    pUVar5 = &this->yesYesCompositions;
    sVar1 = (this->yesYesCompositions).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (this->yesYesCompositions).fUnion.fFields.fLength;
    }
    else {
LAB_001df88e:
      iVar3 = (int)sVar1 >> 5;
    }
    goto LAB_001df891;
  case YES_NO_COMBINES_FWD:
    pUVar5 = &this->yesNoMappingsAndCompositions;
    sVar1 = (this->yesNoMappingsAndCompositions).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar4 = (this->yesNoMappingsAndCompositions).fUnion.fFields.fLength;
    }
    else {
      iVar4 = (int)sVar1 >> 5;
    }
    iVar7 = writeMapping(this,c,norm,pUVar5);
    norm->offset = iVar7 + iVar4;
    goto LAB_001df926;
  case YES_NO_MAPPING_ONLY:
    sVar1 = (this->yesNoMappingsOnly).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar7 = (this->yesNoMappingsOnly).fUnion.fFields.fLength;
    }
    else {
      iVar7 = (int)sVar1 >> 5;
    }
    iVar4 = writeMapping(this,c,norm,&this->yesNoMappingsOnly);
    iVar4 = iVar4 + iVar7;
    goto LAB_001df944;
  case NO_NO_COMP_YES:
    if ((this->optimizeFast == '\0') && (UVar2 = setNoNoDelta(this,c,norm), UVar2 != '\0')) {
      return;
    }
    pUVar5 = &this->noNoMappingsCompYes;
    previousMappings = &this->previousNoNoMappingsCompYes;
    break;
  case NO_NO_COMP_BOUNDARY_BEFORE:
    if ((this->optimizeFast == '\0') && (UVar2 = setNoNoDelta(this,c,norm), UVar2 != '\0')) {
      return;
    }
    pUVar5 = &this->noNoMappingsCompBoundaryBefore;
    previousMappings = &this->previousNoNoMappingsCompBoundaryBefore;
    break;
  case NO_NO_COMP_NO_MAYBE_CC:
    pUVar5 = &this->noNoMappingsCompNoMaybeCC;
    previousMappings = &this->previousNoNoMappingsCompNoMaybeCC;
    break;
  case NO_NO_EMPTY:
    pUVar5 = &this->noNoMappingsEmpty;
    previousMappings = &this->previousNoNoMappingsEmpty;
    break;
  default:
    exit(5);
  case MAYBE_YES_COMBINES_FWD:
    pUVar5 = &this->maybeYesCompositions;
    sVar1 = (this->maybeYesCompositions).fUnion.fStackFields.fLengthAndFlags;
    if (-1 < sVar1) goto LAB_001df88e;
    iVar3 = (this->maybeYesCompositions).fUnion.fFields.fLength;
LAB_001df891:
    norm->offset = iVar3;
LAB_001df926:
    writeCompositions(this,c,norm,pUVar5);
    return;
  }
  iVar4 = writeNoNoMapping(pEVar6,c,norm,pUVar5,previousMappings);
LAB_001df944:
  norm->offset = iVar4;
switchD_001df820_caseD_1:
  return;
}

Assistant:

void ExtraData::writeExtraData(UChar32 c, Norm &norm) {
    switch(norm.type) {
    case Norm::INERT:
        break;  // no extra data
    case Norm::YES_YES_COMBINES_FWD:
        norm.offset=yesYesCompositions.length();
        writeCompositions(c, norm, yesYesCompositions);
        break;
    case Norm::YES_NO_COMBINES_FWD:
        norm.offset=yesNoMappingsAndCompositions.length()+
                writeMapping(c, norm, yesNoMappingsAndCompositions);
        writeCompositions(c, norm, yesNoMappingsAndCompositions);
        break;
    case Norm::YES_NO_MAPPING_ONLY:
        norm.offset=yesNoMappingsOnly.length()+
                writeMapping(c, norm, yesNoMappingsOnly);
        break;
    case Norm::NO_NO_COMP_YES:
        if(!optimizeFast && setNoNoDelta(c, norm)) {
            break;
        }
        norm.offset=writeNoNoMapping(c, norm, noNoMappingsCompYes, previousNoNoMappingsCompYes);
        break;
    case Norm::NO_NO_COMP_BOUNDARY_BEFORE:
        if(!optimizeFast && setNoNoDelta(c, norm)) {
            break;
        }
        norm.offset=writeNoNoMapping(
            c, norm, noNoMappingsCompBoundaryBefore, previousNoNoMappingsCompBoundaryBefore);
        break;
    case Norm::NO_NO_COMP_NO_MAYBE_CC:
        norm.offset=writeNoNoMapping(
            c, norm, noNoMappingsCompNoMaybeCC, previousNoNoMappingsCompNoMaybeCC);
        break;
    case Norm::NO_NO_EMPTY:
        // There can be multiple extra data entries for mappings to the empty string
        // if they have different raw mappings.
        norm.offset=writeNoNoMapping(c, norm, noNoMappingsEmpty, previousNoNoMappingsEmpty);
        break;
    case Norm::MAYBE_YES_COMBINES_FWD:
        norm.offset=maybeYesCompositions.length();
        writeCompositions(c, norm, maybeYesCompositions);
        break;
    case Norm::MAYBE_YES_SIMPLE:
        break;  // no extra data
    case Norm::YES_YES_WITH_CC:
        break;  // no extra data
    default:  // Should not occur.
        exit(U_INTERNAL_PROGRAM_ERROR);
    }
}